

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void __thiscall
icu_63::NFRule::parseRuleDescriptor(NFRule *this,UnicodeString *description,UErrorCode *status)

{
  undefined4 uVar1;
  UBool UVar2;
  int8_t iVar3;
  char16_t cVar4;
  int16_t iVar5;
  int32_t iVar6;
  bool bVar7;
  ConstChar16Ptr local_b8;
  ConstChar16Ptr local_b0;
  ConstChar16Ptr local_a8;
  int local_9c;
  long local_98;
  int64_t ll_10;
  long lStack_88;
  UChar c;
  int64_t val;
  int local_78;
  UChar lastChar;
  UChar firstChar;
  int descriptorLength;
  undefined1 local_68 [8];
  UnicodeString descriptor;
  int32_t p;
  UErrorCode *status_local;
  UnicodeString *description_local;
  NFRule *this_local;
  
  descriptor.fUnion._52_4_ = UnicodeString::indexOf(description,L':');
  if (descriptor.fUnion._52_4_ == -1) goto LAB_002cfa50;
  UnicodeString::UnicodeString((UnicodeString *)local_68);
  UnicodeString::setTo((UnicodeString *)local_68,description,0,descriptor.fUnion._52_4_);
  do {
    descriptor.fUnion._52_4_ = descriptor.fUnion._52_4_ + 1;
    uVar1 = descriptor.fUnion._52_4_;
    iVar6 = UnicodeString::length(description);
    bVar7 = false;
    if ((int)uVar1 < iVar6) {
      cVar4 = UnicodeString::charAt(description,descriptor.fUnion._52_4_);
      UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar4);
      bVar7 = UVar2 != '\0';
    }
  } while (bVar7);
  UnicodeString::removeBetween(description,0,descriptor.fUnion._52_4_);
  local_78 = UnicodeString::length((UnicodeString *)local_68);
  val._6_2_ = UnicodeString::charAt((UnicodeString *)local_68,0);
  val._4_2_ = UnicodeString::charAt((UnicodeString *)local_68,local_78 + -1);
  if ((((ushort)val._6_2_ < 0x30) || (0x39 < (ushort)val._6_2_)) || (val._4_2_ == L'x')) {
    ConstChar16Ptr::ConstChar16Ptr(&local_a8,L"-x");
    iVar3 = UnicodeString::compare((UnicodeString *)local_68,&local_a8,2);
    ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
    if (iVar3 == '\0') {
      setType(this,kNegativeNumberRule);
    }
    else if (local_78 == 3) {
      if ((val._6_2_ == L'0') && (val._4_2_ == L'x')) {
        setBaseValue(this,-3,status);
        cVar4 = UnicodeString::charAt((UnicodeString *)local_68,1);
        this->decimalPoint = cVar4;
      }
      else if ((val._6_2_ == L'x') && (val._4_2_ == L'x')) {
        setBaseValue(this,-2,status);
        cVar4 = UnicodeString::charAt((UnicodeString *)local_68,1);
        this->decimalPoint = cVar4;
      }
      else if ((val._6_2_ == L'x') && (val._4_2_ == L'0')) {
        setBaseValue(this,-4,status);
        cVar4 = UnicodeString::charAt((UnicodeString *)local_68,1);
        this->decimalPoint = cVar4;
      }
      else {
        ConstChar16Ptr::ConstChar16Ptr(&local_b0,L"NaN");
        iVar3 = UnicodeString::compare((UnicodeString *)local_68,&local_b0,3);
        ConstChar16Ptr::~ConstChar16Ptr(&local_b0);
        if (iVar3 == '\0') {
          setBaseValue(this,-6,status);
        }
        else {
          ConstChar16Ptr::ConstChar16Ptr(&local_b8,L"Inf");
          iVar3 = UnicodeString::compare((UnicodeString *)local_68,&local_b8,3);
          ConstChar16Ptr::~ConstChar16Ptr(&local_b8);
          if (iVar3 == '\0') {
            setBaseValue(this,-5,status);
          }
        }
      }
    }
LAB_002cfa22:
    local_9c = 0;
  }
  else {
    lStack_88 = 0;
    ll_10._6_2_ = L' ';
    local_98 = 10;
    for (descriptor.fUnion._52_4_ = 0; (int)descriptor.fUnion._52_4_ < local_78;
        descriptor.fUnion._52_4_ = descriptor.fUnion._52_4_ + 1) {
      ll_10._6_2_ = UnicodeString::charAt((UnicodeString *)local_68,descriptor.fUnion._52_4_);
      if (((ushort)ll_10._6_2_ < 0x30) || (0x39 < (ushort)ll_10._6_2_)) {
        if ((ll_10._6_2_ == L'/') || (ll_10._6_2_ == L'>')) break;
        UVar2 = PatternProps::isWhiteSpace((uint)(ushort)ll_10._6_2_);
        if (((UVar2 == '\0') && (ll_10._6_2_ != L',')) && (ll_10._6_2_ != L'.')) {
          *status = U_PARSE_ERROR;
          local_9c = 1;
          goto LAB_002cfa2c;
        }
      }
      else {
        lStack_88 = lStack_88 * local_98 + (long)(int)((ushort)ll_10._6_2_ - 0x30);
      }
    }
    setBaseValue(this,lStack_88,status);
    if (ll_10._6_2_ != L'/') {
LAB_002cf693:
      if (ll_10._6_2_ == L'>') {
        for (; uVar1 = descriptor.fUnion._52_4_,
            iVar6 = UnicodeString::length((UnicodeString *)local_68), (int)uVar1 < iVar6;
            descriptor.fUnion._52_4_ = descriptor.fUnion._52_4_ + 1) {
          ll_10._6_2_ = UnicodeString::charAt((UnicodeString *)local_68,descriptor.fUnion._52_4_);
          if ((ll_10._6_2_ != L'>') || (this->exponent < 1)) {
            *status = U_PARSE_ERROR;
            local_9c = 1;
            goto LAB_002cfa2c;
          }
          this->exponent = this->exponent + -1;
        }
      }
      goto LAB_002cfa22;
    }
    lStack_88 = 0;
    local_98 = 10;
LAB_002cf574:
    do {
      descriptor.fUnion._52_4_ = descriptor.fUnion._52_4_ + 1;
      if (local_78 <= (int)descriptor.fUnion._52_4_) {
LAB_002cf64e:
        this->radix = (int32_t)lStack_88;
        if (this->radix == 0) {
          *status = U_PARSE_ERROR;
        }
        iVar5 = expectedExponent(this);
        this->exponent = iVar5;
        goto LAB_002cf693;
      }
      ll_10._6_2_ = UnicodeString::charAt((UnicodeString *)local_68,descriptor.fUnion._52_4_);
      if ((0x2f < (ushort)ll_10._6_2_) && ((ushort)ll_10._6_2_ < 0x3a)) {
        lStack_88 = lStack_88 * local_98 + (long)(int)((ushort)ll_10._6_2_ - 0x30);
        goto LAB_002cf574;
      }
      if (ll_10._6_2_ == L'>') goto LAB_002cf64e;
      UVar2 = PatternProps::isWhiteSpace((uint)(ushort)ll_10._6_2_);
    } while (((UVar2 != '\0') || (ll_10._6_2_ == L',')) || (ll_10._6_2_ == L'.'));
    *status = U_PARSE_ERROR;
    local_9c = 1;
  }
LAB_002cfa2c:
  UnicodeString::~UnicodeString((UnicodeString *)local_68);
  if (local_9c != 0) {
    return;
  }
LAB_002cfa50:
  iVar6 = UnicodeString::length(description);
  if ((0 < iVar6) && (cVar4 = UnicodeString::charAt(description,0), cVar4 == L'\'')) {
    UnicodeString::removeBetween(description,0,1);
  }
  return;
}

Assistant:

void
NFRule::parseRuleDescriptor(UnicodeString& description, UErrorCode& status)
{
    // the description consists of a rule descriptor and a rule body,
    // separated by a colon.  The rule descriptor is optional.  If
    // it's omitted, just set the base value to 0.
    int32_t p = description.indexOf(gColon);
    if (p != -1) {
        // copy the descriptor out into its own string and strip it,
        // along with any trailing whitespace, out of the original
        // description
        UnicodeString descriptor;
        descriptor.setTo(description, 0, p);

        ++p;
        while (p < description.length() && PatternProps::isWhiteSpace(description.charAt(p))) {
            ++p;
        }
        description.removeBetween(0, p);

        // check first to see if the rule descriptor matches the token
        // for one of the special rules.  If it does, set the base
        // value to the correct identifier value
        int descriptorLength = descriptor.length();
        UChar firstChar = descriptor.charAt(0);
        UChar lastChar = descriptor.charAt(descriptorLength - 1);
        if (firstChar >= gZero && firstChar <= gNine && lastChar != gX) {
            // if the rule descriptor begins with a digit, it's a descriptor
            // for a normal rule
            // since we don't have Long.parseLong, and this isn't much work anyway,
            // just build up the value as we encounter the digits.
            int64_t val = 0;
            p = 0;
            UChar c = gSpace;

            // begin parsing the descriptor: copy digits
            // into "tempValue", skip periods, commas, and spaces,
            // stop on a slash or > sign (or at the end of the string),
            // and throw an exception on any other character
            int64_t ll_10 = 10;
            while (p < descriptorLength) {
                c = descriptor.charAt(p);
                if (c >= gZero && c <= gNine) {
                    val = val * ll_10 + (int32_t)(c - gZero);
                }
                else if (c == gSlash || c == gGreaterThan) {
                    break;
                }
                else if (PatternProps::isWhiteSpace(c) || c == gComma || c == gDot) {
                }
                else {
                    // throw new IllegalArgumentException("Illegal character in rule descriptor");
                    status = U_PARSE_ERROR;
                    return;
                }
                ++p;
            }

            // we have the base value, so set it
            setBaseValue(val, status);

            // if we stopped the previous loop on a slash, we're
            // now parsing the rule's radix.  Again, accumulate digits
            // in tempValue, skip punctuation, stop on a > mark, and
            // throw an exception on anything else
            if (c == gSlash) {
                val = 0;
                ++p;
                ll_10 = 10;
                while (p < descriptorLength) {
                    c = descriptor.charAt(p);
                    if (c >= gZero && c <= gNine) {
                        val = val * ll_10 + (int32_t)(c - gZero);
                    }
                    else if (c == gGreaterThan) {
                        break;
                    }
                    else if (PatternProps::isWhiteSpace(c) || c == gComma || c == gDot) {
                    }
                    else {
                        // throw new IllegalArgumentException("Illegal character is rule descriptor");
                        status = U_PARSE_ERROR;
                        return;
                    }
                    ++p;
                }

                // tempValue now contain's the rule's radix.  Set it
                // accordingly, and recalculate the rule's exponent
                radix = (int32_t)val;
                if (radix == 0) {
                    // throw new IllegalArgumentException("Rule can't have radix of 0");
                    status = U_PARSE_ERROR;
                }

                exponent = expectedExponent();
            }

            // if we stopped the previous loop on a > sign, then continue
            // for as long as we still see > signs.  For each one,
            // decrement the exponent (unless the exponent is already 0).
            // If we see another character before reaching the end of
            // the descriptor, that's also a syntax error.
            if (c == gGreaterThan) {
                while (p < descriptor.length()) {
                    c = descriptor.charAt(p);
                    if (c == gGreaterThan && exponent > 0) {
                        --exponent;
                    } else {
                        // throw new IllegalArgumentException("Illegal character in rule descriptor");
                        status = U_PARSE_ERROR;
                        return;
                    }
                    ++p;
                }
            }
        }
        else if (0 == descriptor.compare(gMinusX, 2)) {
            setType(kNegativeNumberRule);
        }
        else if (descriptorLength == 3) {
            if (firstChar == gZero && lastChar == gX) {
                setBaseValue(kProperFractionRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (firstChar == gX && lastChar == gX) {
                setBaseValue(kImproperFractionRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (firstChar == gX && lastChar == gZero) {
                setBaseValue(kMasterRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (descriptor.compare(gNaN, 3) == 0) {
                setBaseValue(kNaNRule, status);
            }
            else if (descriptor.compare(gInf, 3) == 0) {
                setBaseValue(kInfinityRule, status);
            }
        }
    }
    // else use the default base value for now.

    // finally, if the rule body begins with an apostrophe, strip it off
    // (this is generally used to put whitespace at the beginning of
    // a rule's rule text)
    if (description.length() > 0 && description.charAt(0) == gTick) {
        description.removeBetween(0, 1);
    }

    // return the description with all the stuff we've just waded through
    // stripped off the front.  It now contains just the rule body.
    // return description;
}